

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLog>::
ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLog>
               *this,GetterXsYs<int> *getter1,GetterXsYRef<int> *getter2,
              TransformerLogLog *transformer,ImU32 col)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  ImPlotPlot *pIVar6;
  GetterXsYRef<int> *pGVar7;
  TransformerLogLog *pTVar8;
  double dVar9;
  double dVar10;
  ImPlotContext *pIVar11;
  int iVar12;
  long lVar13;
  ImVec2 IVar14;
  ImVec2 IVar15;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar5 = getter1->Count;
  iVar12 = getter2->Count;
  if (iVar5 < getter2->Count) {
    iVar12 = iVar5;
  }
  this->Prims = iVar12 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar11 = GImPlot;
  (this->P12).y = 0.0;
  lVar13 = (long)((getter1->Offset % iVar5 + iVar5) % iVar5) * (long)getter1->Stride;
  iVar5 = *(int *)((long)getter1->Ys + lVar13);
  dVar9 = log10((double)*(int *)((long)getter1->Xs + lVar13) /
                (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar1 = pIVar11->LogDenX;
  pIVar6 = pIVar11->CurrentPlot;
  dVar2 = (pIVar6->XAxis).Range.Min;
  dVar3 = (pIVar6->XAxis).Range.Max;
  dVar10 = log10((double)iVar5 / pIVar6->YAxis[transformer->YAxis].Range.Min);
  iVar5 = transformer->YAxis;
  pIVar6 = pIVar11->CurrentPlot;
  dVar4 = pIVar6->YAxis[iVar5].Range.Min;
  IVar14.x = (float)((((double)(float)(dVar9 / dVar1) * (dVar3 - dVar2) + dVar2) -
                     (pIVar6->XAxis).Range.Min) * pIVar11->Mx +
                    (double)pIVar11->PixelRange[iVar5].Min.x);
  IVar14.y = (float)((((double)(float)(dVar10 / pIVar11->LogDenY[iVar5]) *
                       (pIVar6->YAxis[iVar5].Range.Max - dVar4) + dVar4) - dVar4) *
                     pIVar11->My[iVar5] + (double)pIVar11->PixelRange[iVar5].Min.y);
  this->P11 = IVar14;
  pIVar11 = GImPlot;
  pGVar7 = this->Getter2;
  pTVar8 = this->Transformer;
  iVar5 = pGVar7->Count;
  dVar1 = pGVar7->YRef;
  dVar9 = log10((double)*(int *)((long)pGVar7->Xs +
                                (long)((pGVar7->Offset % iVar5 + iVar5) % iVar5) *
                                (long)pGVar7->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar2 = pIVar11->LogDenX;
  pIVar6 = pIVar11->CurrentPlot;
  dVar3 = (pIVar6->XAxis).Range.Min;
  dVar4 = (pIVar6->XAxis).Range.Max;
  dVar10 = log10(dVar1 / pIVar6->YAxis[pTVar8->YAxis].Range.Min);
  iVar5 = pTVar8->YAxis;
  pIVar6 = pIVar11->CurrentPlot;
  dVar1 = pIVar6->YAxis[iVar5].Range.Min;
  IVar15.x = (float)((((double)(float)(dVar9 / dVar2) * (dVar4 - dVar3) + dVar3) -
                     (pIVar6->XAxis).Range.Min) * pIVar11->Mx +
                    (double)pIVar11->PixelRange[iVar5].Min.x);
  IVar15.y = (float)((((double)(float)(dVar10 / pIVar11->LogDenY[iVar5]) *
                       (pIVar6->YAxis[iVar5].Range.Max - dVar1) + dVar1) - dVar1) *
                     pIVar11->My[iVar5] + (double)pIVar11->PixelRange[iVar5].Min.y);
  this->P12 = IVar15;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }